

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O3

FT_Error tt_sbit_decoder_load_image
                   (TT_SBitDecoder decoder,FT_UInt glyph_index,FT_Int x_pos,FT_Int y_pos,
                   FT_UInt recurse_count,FT_Bool metrics_only)

{
  FT_Byte *pFVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  FT_ULong FVar5;
  FT_Byte *pFVar6;
  ushort *limit;
  ushort uVar7;
  FT_Error FVar8;
  ushort *puVar9;
  uint *puVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ushort *puVar16;
  ulong uVar17;
  ushort uVar18;
  FT_ULong FVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  uint *local_40;
  ulong local_38;
  
  if (100 < recurse_count) {
    return 8;
  }
  if (decoder->strike_index_count != 0) {
    FVar5 = decoder->strike_index_array;
    pFVar6 = decoder->eblc_base;
    pFVar1 = pFVar6 + FVar5;
    limit = (ushort *)decoder->eblc_limit;
    FVar19 = 0;
LAB_00248512:
    uVar14 = (uint)(ushort)(*(ushort *)(pFVar6 + FVar19 * 8 + FVar5) << 8 |
                           *(ushort *)(pFVar6 + FVar19 * 8 + FVar5) >> 8);
    uVar21 = glyph_index - uVar14;
    if ((glyph_index < uVar14) ||
       ((ushort)(*(ushort *)(pFVar6 + FVar19 * 8 + FVar5 + 2) << 8 |
                *(ushort *)(pFVar6 + FVar19 * 8 + FVar5 + 2) >> 8) < glyph_index))
    goto LAB_0024853d;
    lVar11 = (ulong)pFVar1[FVar19 * 8 + 5] * 0x10000;
    uVar13 = (ulong)pFVar1[FVar19 * 8 + 6] * 0x100;
    uVar15 = (ulong)pFVar1[FVar19 * 8 + 7];
    uVar20 = lVar11 + (ulong)pFVar1[FVar19 * 8 + 4] * 0x1000000 | uVar13 | uVar15;
    if ((ulong)((long)limit - (long)pFVar1) < uVar20) {
      return 8;
    }
    puVar9 = (ushort *)(pFVar1 + uVar20 + 8);
    if (limit < puVar9) goto LAB_00248545;
    puVar16 = (ushort *)(pFVar1 + uVar20);
    uVar4 = puVar16[1];
    uVar18 = *puVar16 << 8 | *puVar16 >> 8;
    local_38 = (ulong)*(uint *)(puVar16 + 2);
    switch(uVar18) {
    case 1:
      if (limit < (ushort *)((long)puVar9 + (ulong)(uVar21 * 4) + 8)) goto LAB_00248545;
      puVar10 = (uint *)((long)puVar9 + (ulong)(uVar21 * 4));
      uVar14 = *puVar10;
      uVar21 = puVar10[1];
      uVar15 = (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                      uVar14 << 0x18);
      uVar13 = (ulong)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                      uVar21 << 0x18);
      break;
    case 2:
      if (puVar16 + 10 <= limit) {
        local_40 = (uint *)(puVar16 + 6);
        uVar18 = puVar16[4];
        bVar2 = *(byte *)((long)puVar16 + 9);
        uVar7 = puVar16[5];
        bVar3 = *(byte *)((long)puVar16 + 0xb);
        FVar8 = tt_sbit_decoder_load_metrics(decoder,(FT_Byte **)&local_40,(FT_Byte *)limit,'\x01');
        if (FVar8 == 0) {
          lVar11 = (ulong)((uint)(byte)uVar7 << 8 | (uint)bVar2 << 0x10 | (uint)(byte)uVar18 << 0x18
                          ) + (ulong)bVar3;
          uVar15 = (ulong)uVar21 * lVar11;
          uVar13 = lVar11 + uVar15;
          goto LAB_00248838;
        }
      }
      goto LAB_00248545;
    case 3:
      if (limit < (ushort *)((long)puVar9 + (ulong)(uVar21 * 2) + 4)) goto LAB_00248545;
      puVar9 = (ushort *)((long)puVar9 + (ulong)(uVar21 * 2));
      uVar18 = *puVar9;
      uVar7 = puVar9[1];
      uVar15 = (ulong)(ushort)(uVar18 << 8 | uVar18 >> 8);
      uVar13 = (ulong)(ushort)(uVar7 << 8 | uVar7 >> 8);
      break;
    case 4:
      if ((puVar16 + 6 <= limit) && (puVar16 + 8 <= limit)) {
        uVar20 = (ulong)(byte)puVar16[5] << 8 |
                 (ulong)*(byte *)((long)puVar16 + 9) << 0x10 | (ulong)(byte)puVar16[4] << 0x18;
        if ((*(byte *)((long)puVar16 + 0xb) + uVar20) - 1 <
            ((long)limit - (long)(puVar16 + 6) >> 2) - 1U) {
          lVar12 = FVar5 + (ulong)pFVar1[FVar19 * 8 + 4] * 0x1000000;
          uVar17 = 0;
          goto LAB_0024874e;
        }
      }
      goto LAB_00248545;
    case 5:
      goto switchD_002485e8_caseD_5;
    default:
      if (uVar18 == 0x13) {
switchD_002485e8_caseD_5:
        if (puVar16 + 0xc <= limit) {
          local_40 = (uint *)(puVar16 + 6);
          uVar18 = puVar16[4];
          bVar2 = *(byte *)((long)puVar16 + 9);
          uVar7 = puVar16[5];
          bVar3 = *(byte *)((long)puVar16 + 0xb);
          FVar8 = tt_sbit_decoder_load_metrics
                            (decoder,(FT_Byte **)&local_40,(FT_Byte *)limit,'\x01');
          if (FVar8 == 0) {
            uVar14 = *local_40;
            uVar13 = (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                            uVar14 << 0x18);
            if (uVar13 - 1 < (ulong)((long)limit - (long)(local_40 + 1) >> 1)) {
              lVar11 = (ulong)bVar2 * 0x10000 + (ulong)(byte)uVar18 * 0x1000000;
              lVar12 = (ulong)(byte)uVar7 * 0x100;
              lVar22 = 0;
              uVar15 = 0;
              goto LAB_002486ba;
            }
          }
        }
      }
      goto LAB_00248545;
    }
    if (uVar15 != uVar13) goto LAB_00248820;
  }
  goto LAB_00248545;
LAB_0024853d:
  FVar19 = FVar19 + 1;
  if (decoder->strike_index_count == FVar19) goto LAB_00248545;
  goto LAB_00248512;
  while( true ) {
    uVar15 = uVar15 + 1;
    lVar22 = lVar22 - ((ulong)bVar3 + lVar12 + lVar11);
    if (uVar13 == uVar15) break;
LAB_002486ba:
    uVar18 = *(ushort *)((long)(local_40 + 1) + uVar15 * 2);
    if ((ushort)(uVar18 << 8 | uVar18 >> 8) == glyph_index) {
      uVar13 = (lVar11 + lVar12 + (ulong)bVar3) - lVar22;
      uVar15 = -lVar22;
      goto LAB_00248838;
    }
  }
  goto LAB_00248545;
  while (uVar17 = uVar17 + 1, (uVar20 | *(byte *)((long)puVar16 + 0xb)) != uVar17) {
LAB_0024874e:
    if ((ushort)(*(ushort *)(pFVar6 + uVar17 * 4 + lVar11 + uVar13 + lVar12 + uVar15 + 0xc) << 8 |
                *(ushort *)(pFVar6 + uVar17 * 4 + lVar11 + uVar13 + lVar12 + uVar15 + 0xc) >> 8) ==
        glyph_index) {
      lVar11 = lVar12 + lVar11 + uVar13 + uVar15;
      uVar15 = (ulong)(ushort)(*(ushort *)(pFVar6 + uVar17 * 4 + lVar11 + 0xe) << 8 |
                              *(ushort *)(pFVar6 + uVar17 * 4 + lVar11 + 0xe) >> 8);
      uVar13 = (ulong)(ushort)(*(ushort *)(pFVar6 + uVar17 * 4 + lVar11 + 0x12) << 8 |
                              *(ushort *)(pFVar6 + uVar17 * 4 + lVar11 + 0x12) >> 8);
LAB_00248820:
      if ((uint)uVar15 <= (uint)uVar13) {
LAB_00248838:
        uVar14 = (uint)local_38;
        FVar8 = tt_sbit_decoder_load_bitmap
                          (decoder,(uint)(ushort)(uVar4 << 8 | uVar4 >> 8),
                           (uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                           uVar14 << 0x18) + uVar15,uVar13 - uVar15,x_pos,y_pos,recurse_count,
                           metrics_only);
        return FVar8;
      }
      break;
    }
  }
LAB_00248545:
  FVar8 = 0x15;
  if (recurse_count == 0) {
    FVar8 = 0x9d;
  }
  return FVar8;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_image( TT_SBitDecoder  decoder,
                              FT_UInt         glyph_index,
                              FT_Int          x_pos,
                              FT_Int          y_pos,
                              FT_UInt         recurse_count,
                              FT_Bool         metrics_only )
  {
    FT_Byte*  p          = decoder->eblc_base + decoder->strike_index_array;
    FT_Byte*  p_limit    = decoder->eblc_limit;
    FT_ULong  num_ranges = decoder->strike_index_count;
    FT_UInt   start, end, index_format, image_format;
    FT_ULong  image_start = 0, image_end = 0, image_offset;


    /* arbitrary recursion limit */
    if ( recurse_count > 100 )
    {
      FT_TRACE4(( "tt_sbit_decoder_load_image:"
                  " recursion depth exceeded\n" ));
      goto Failure;
    }


    /* First, we find the correct strike range that applies to this */
    /* glyph index.                                                 */
    for ( ; num_ranges > 0; num_ranges-- )
    {
      start = FT_NEXT_USHORT( p );
      end   = FT_NEXT_USHORT( p );

      if ( glyph_index >= start && glyph_index <= end )
        goto FoundRange;

      p += 4;  /* ignore index offset */
    }
    goto NoBitmap;

  FoundRange:
    image_offset = FT_NEXT_ULONG( p );

    /* overflow check */
    p = decoder->eblc_base + decoder->strike_index_array;
    if ( image_offset > (FT_ULong)( p_limit - p ) )
      goto Failure;

    p += image_offset;
    if ( p + 8 > p_limit )
      goto NoBitmap;

    /* now find the glyph's location and extend within the ebdt table */
    index_format = FT_NEXT_USHORT( p );
    image_format = FT_NEXT_USHORT( p );
    image_offset = FT_NEXT_ULONG ( p );

    switch ( index_format )
    {
    case 1: /* 4-byte offsets relative to `image_offset' */
      p += 4 * ( glyph_index - start );
      if ( p + 8 > p_limit )
        goto NoBitmap;

      image_start = FT_NEXT_ULONG( p );
      image_end   = FT_NEXT_ULONG( p );

      if ( image_start == image_end )  /* missing glyph */
        goto NoBitmap;
      break;

    case 2: /* big metrics, constant image size */
      {
        FT_ULong  image_size;


        if ( p + 12 > p_limit )
          goto NoBitmap;

        image_size = FT_NEXT_ULONG( p );

        if ( tt_sbit_decoder_load_metrics( decoder, &p, p_limit, 1 ) )
          goto NoBitmap;

        image_start = image_size * ( glyph_index - start );
        image_end   = image_start + image_size;
      }
      break;

    case 3: /* 2-byte offsets relative to 'image_offset' */
      p += 2 * ( glyph_index - start );
      if ( p + 4 > p_limit )
        goto NoBitmap;

      image_start = FT_NEXT_USHORT( p );
      image_end   = FT_NEXT_USHORT( p );

      if ( image_start == image_end )  /* missing glyph */
        goto NoBitmap;
      break;

    case 4: /* sparse glyph array with (glyph,offset) pairs */
      {
        FT_ULong  mm, num_glyphs;


        if ( p + 4 > p_limit )
          goto NoBitmap;

        num_glyphs = FT_NEXT_ULONG( p );

        /* overflow check for p + ( num_glyphs + 1 ) * 4 */
        if ( p + 4 > p_limit                                         ||
             num_glyphs > (FT_ULong)( ( ( p_limit - p ) >> 2 ) - 1 ) )
          goto NoBitmap;

        for ( mm = 0; mm < num_glyphs; mm++ )
        {
          FT_UInt  gindex = FT_NEXT_USHORT( p );


          if ( gindex == glyph_index )
          {
            image_start = FT_NEXT_USHORT( p );
            p          += 2;
            image_end   = FT_PEEK_USHORT( p );
            break;
          }
          p += 2;
        }

        if ( mm >= num_glyphs )
          goto NoBitmap;
      }
      break;

    case 5: /* constant metrics with sparse glyph codes */
    case 19:
      {
        FT_ULong  image_size, mm, num_glyphs;


        if ( p + 16 > p_limit )
          goto NoBitmap;

        image_size = FT_NEXT_ULONG( p );

        if ( tt_sbit_decoder_load_metrics( decoder, &p, p_limit, 1 ) )
          goto NoBitmap;

        num_glyphs = FT_NEXT_ULONG( p );

        /* overflow check for p + 2 * num_glyphs */
        if ( num_glyphs > (FT_ULong)( ( p_limit - p ) >> 1 ) )
          goto NoBitmap;

        for ( mm = 0; mm < num_glyphs; mm++ )
        {
          FT_UInt  gindex = FT_NEXT_USHORT( p );


          if ( gindex == glyph_index )
            break;
        }

        if ( mm >= num_glyphs )
          goto NoBitmap;

        image_start = image_size * mm;
        image_end   = image_start + image_size;
      }
      break;

    default:
      goto NoBitmap;
    }

    if ( image_start > image_end )
      goto NoBitmap;

    image_end  -= image_start;
    image_start = image_offset + image_start;

    FT_TRACE3(( "tt_sbit_decoder_load_image:"
                " found sbit (format %d) for glyph index %d\n",
                image_format, glyph_index ));

    return tt_sbit_decoder_load_bitmap( decoder,
                                        image_format,
                                        image_start,
                                        image_end,
                                        x_pos,
                                        y_pos,
                                        recurse_count,
                                        metrics_only );

  Failure:
    return FT_THROW( Invalid_Table );

  NoBitmap:
    if ( recurse_count )
    {
      FT_TRACE4(( "tt_sbit_decoder_load_image:"
                  " missing subglyph sbit with glyph index %d\n",
                  glyph_index ));
      return FT_THROW( Invalid_Composite );
    }

    FT_TRACE4(( "tt_sbit_decoder_load_image:"
                " no sbit found for glyph index %d\n", glyph_index ));
    return FT_THROW( Missing_Bitmap );
  }